

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001bcfe0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001bcfe7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001bcfd0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001bcfd8 = 0x2d2d2d2d2d2d2d;
    DAT_001bcfdf = 0x2d;
    _DAT_001bcfc0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001bcfc8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001bcfb0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001bcfb8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001bcfa8 = 0x2d2d2d2d2d2d2d2d;
    DAT_001bcfef = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}